

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O2

UChar __thiscall
icu_63::FCDUIterCollationIterator::handleGetTrailSurrogate(FCDUIterCollationIterator *this)

{
  char16_t cVar1;
  uint uVar2;
  
  if ((int)this->state < 3) {
    uVar2 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
    if ((uVar2 & 0xfffffc00) != 0xdc00) {
      if (-1 < (int)uVar2) {
        (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
      }
      goto LAB_002281c3;
    }
    if (this->state != ITER_IN_FCD_SEGMENT) goto LAB_002281c3;
  }
  else {
    cVar1 = UnicodeString::doCharAt(&this->normalized,this->pos);
    uVar2 = (uint)(ushort)cVar1;
    if ((cVar1 & 0xfc00U) != 0xdc00) goto LAB_002281c3;
  }
  this->pos = this->pos + 1;
LAB_002281c3:
  return (UChar)uVar2;
}

Assistant:

UChar
FCDUIterCollationIterator::handleGetTrailSurrogate() {
    if(state <= ITER_IN_FCD_SEGMENT) {
        UChar32 trail = iter.next(&iter);
        if(U16_IS_TRAIL(trail)) {
            if(state == ITER_IN_FCD_SEGMENT) { ++pos; }
        } else if(trail >= 0) {
            iter.previous(&iter);
        }
        return (UChar)trail;
    } else {
        U_ASSERT(pos < normalized.length());
        UChar trail;
        if(U16_IS_TRAIL(trail = normalized[pos])) { ++pos; }
        return trail;
    }
}